

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

UnknownFieldSet * __thiscall
google::protobuf::Reflection::MutableUnknownFields(Reflection *this,Message *message)

{
  Descriptor *expected;
  UnknownFieldSet *pUVar1;
  Metadata MVar2;
  
  MVar2 = Message::GetMetadata(message);
  if (MVar2.reflection == this) {
    pUVar1 = internal::InternalMetadata::mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                       (&(message->super_MessageLite)._internal_metadata_);
    return pUVar1;
  }
  expected = this->descriptor_;
  MVar2 = Message::GetMetadata(message);
  anon_unknown_6::ReportReflectionUsageMessageError
            (expected,MVar2.descriptor,(FieldDescriptor *)0x0,"MutableUnknownFields");
}

Assistant:

UnknownFieldSet* Reflection::MutableUnknownFields(Message* message) const {
  STATIC_USAGE_CHECK_MESSAGE(MutableUnknownFields, message);
  return MutableInternalMetadata(message)
      ->mutable_unknown_fields<UnknownFieldSet>();
}